

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

void tinyexr::DecodePixelData
               (uchar **out_images,int *requested_pixel_types,uchar *data_ptr,size_t data_len,
               int compression_type,int line_order,int width,int height,int x_stride,int y,
               int line_no,int num_lines,size_t pixel_data_size,size_t num_attributes,
               EXRAttribute *attributes,size_t num_channels,EXRChannelInfo *channels,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *channel_offset_list)

{
  uchar *puVar1;
  FP32 FVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int v;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  FP16 h;
  FP16 h_00;
  FP16 h_01;
  FP16 h_02;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int u_1;
  int iVar20;
  long lVar21;
  size_type sVar22;
  ulong uVar23;
  long lVar24;
  size_t sVar25;
  reference pvVar26;
  unsigned_long dstLen;
  char *outStart;
  uchar *local_b8;
  size_t local_90;
  allocator_type local_81;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  long local_68;
  int *local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  reference local_40;
  size_type local_38;
  
  local_68 = (long)x_stride;
  lVar3 = (long)width;
  local_60 = requested_pixel_types;
  if (compression_type == 4) {
    sVar22 = (long)(num_lines * width) * pixel_data_size;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,sVar22,
               (allocator_type *)&local_58);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
    DecompressPiz(pvVar4,data_ptr,sVar22,(int)num_attributes,(EXRChannelInfo *)attributes,width,
                  num_lines);
    uVar23 = 0;
    uVar11 = (ulong)(uint)width;
    if (width < 1) {
      uVar11 = uVar23;
    }
    uVar10 = (ulong)(uint)num_lines;
    if (num_lines < 1) {
      uVar10 = uVar23;
    }
    uVar16 = num_attributes & 0xffffffff;
    if ((int)num_attributes < 1) {
      uVar16 = uVar23;
    }
    for (; uVar23 != uVar16; uVar23 = uVar23 + 1) {
      iVar8 = *(int *)(attributes->type + uVar23 * 0x110);
      if (iVar8 == 0) {
        for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (uVar17 * pixel_data_size +
                              *(long *)(*(long *)num_channels + uVar23 * 8)) * lVar3);
          uVar7 = line_no + (int)uVar17;
          uVar15 = ~uVar7 + height;
          if (line_order == 0) {
            uVar15 = uVar7;
          }
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined4 *)(out_images[uVar23] + uVar12 * 4 + (long)(int)(uVar15 * x_stride) * 4) =
                 *(undefined4 *)(pvVar4 + uVar12 * 4);
          }
        }
      }
      else if (iVar8 == 1) {
        for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (uVar17 * pixel_data_size +
                              *(long *)(*(long *)num_channels + uVar23 * 8)) * lVar3);
          uVar7 = line_no + (int)uVar17;
          uVar15 = ~uVar7 + height;
          if (line_order == 0) {
            uVar15 = uVar7;
          }
          lVar18 = (long)(int)(uVar15 * x_stride);
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            if (local_60[uVar23] == 1) {
              *(ushort *)(out_images[uVar23] + lVar18 * 2) = *(ushort *)(pvVar4 + uVar12 * 2);
            }
            else {
              h._2_2_ = 0;
              h.u = *(ushort *)(pvVar4 + uVar12 * 2);
              FVar2 = half_to_float(h);
              *(FP32 *)(out_images[uVar23] + lVar18 * 4) = FVar2;
            }
            lVar18 = lVar18 + 1;
          }
        }
      }
      else if (iVar8 == 2) {
        for (uVar17 = 0; uVar17 != uVar10; uVar17 = uVar17 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (uVar17 * pixel_data_size +
                              *(long *)(*(long *)num_channels + uVar23 * 8)) * local_68);
          uVar7 = line_no + (int)uVar17;
          uVar15 = ~uVar7 + height;
          if (line_order == 0) {
            uVar15 = uVar7;
          }
          for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
            *(undefined4 *)(out_images[uVar23] + uVar12 * 4 + (long)(int)(uVar15 * x_stride) * 4) =
                 *(undefined4 *)(pvVar4 + uVar12 * 4);
          }
        }
      }
    }
  }
  else {
    lVar24 = (long)num_lines;
    lVar18 = (long)height;
    lVar9 = (long)line_no;
    if ((compression_type & 0xfffffffeU) != 2) {
      local_b8 = data_ptr;
      if (compression_type != 1) {
        if (compression_type != 0) {
          return;
        }
        iVar8 = ~y + height;
        if (line_order == 0) {
          iVar8 = y;
        }
        uVar23 = 0;
        uVar11 = (ulong)(uint)width;
        if (width < 1) {
          uVar11 = uVar23;
        }
        lVar18 = (long)(iVar8 * x_stride) * 4;
        for (; uVar23 != num_attributes; uVar23 = uVar23 + 1) {
          iVar20 = *(int *)(attributes->type + uVar23 * 0x110);
          if (iVar20 == 0) {
            puVar1 = out_images[uVar23];
            for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
              *(undefined4 *)(puVar1 + uVar10 * 4 + lVar18) = *(undefined4 *)(data_ptr + uVar10 * 4)
              ;
            }
          }
          else if (iVar20 == 2) {
            puVar1 = out_images[uVar23];
            for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
              *(undefined4 *)(puVar1 + uVar10 * 4 + lVar18) = *(undefined4 *)(data_ptr + uVar10 * 4)
              ;
            }
          }
          else if (iVar20 == 1) {
            if (local_60[uVar23] == 2) {
              puVar1 = out_images[uVar23];
              for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
                h_01._2_2_ = 0;
                h_01.u = *(ushort *)(local_b8 + uVar10 * 2);
                FVar2 = half_to_float(h_01);
                *(FP32 *)(puVar1 + uVar10 * 4 + lVar18) = FVar2;
              }
            }
            else if (local_60[uVar23] == 1) {
              puVar1 = out_images[uVar23];
              for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
                *(undefined2 *)(puVar1 + uVar10 * 2 + (long)(iVar8 * x_stride) * 2) =
                     *(undefined2 *)(local_b8 + uVar10 * 2);
              }
            }
          }
          data_ptr = data_ptr + lVar3 * 4;
          local_b8 = local_b8 + lVar3 * 2;
        }
        return;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                 lVar24 * lVar3 * pixel_data_size,(allocator_type *)&local_80);
      sVar22 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58._M_impl.super__Vector_impl_data._M_start;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,sVar22,&local_81
                );
      local_90 = data_len;
      local_40 = pvVar4;
      local_38 = sVar22;
      while (iVar8 = (int)local_90, 0 < iVar8) {
        iVar20 = (int)(char)*local_b8;
        if ((char)*local_b8 < '\0') {
          uVar15 = (int)sVar22 + iVar20;
          if ((int)uVar15 < 0) break;
          uVar7 = (iVar8 + iVar20) - 1;
          uVar11 = (ulong)(uint)-iVar20;
          memcpy(pvVar4,local_b8 + 1,uVar11);
          local_b8 = local_b8 + uVar11 + 1;
        }
        else {
          uVar15 = (int)sVar22 - (iVar20 + 1U);
          if ((int)uVar15 < 0) break;
          uVar7 = iVar8 - 2;
          uVar11 = (ulong)(iVar20 + 1U);
          memset(pvVar4,(uint)local_b8[1],uVar11);
          local_b8 = local_b8 + 2;
        }
        sVar22 = (size_type)uVar15;
        pvVar4 = pvVar4 + uVar11;
        local_90 = (size_t)uVar7;
      }
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
      sVar22 = local_38;
      pvVar4 = local_40;
      while (pvVar26 = pvVar5 + 1, pvVar26 < pvVar6 + local_38) {
        *pvVar26 = *pvVar26 + *pvVar5 + 0x80;
        pvVar5 = pvVar26;
      }
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
      pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
      pvVar26 = pvVar4 + sVar22;
      lVar14 = 0;
      for (; pvVar4 < pvVar26; pvVar4 = pvVar4 + 2) {
        *pvVar4 = pvVar5[lVar14];
        if (pvVar26 <= pvVar4 + 1) break;
        pvVar4[1] = pvVar6[lVar14 + (sVar22 + 1 >> 1)];
        lVar14 = lVar14 + 1;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
      lVar14 = local_68 * 4;
      for (sVar25 = 0; sVar25 != num_attributes; sVar25 = sVar25 + 1) {
        iVar8 = *(int *)(attributes->type + sVar25 * 0x110);
        if (iVar8 == 0) {
          for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                                (lVar19 * pixel_data_size +
                                *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
            uVar11 = ~(lVar19 + lVar9) + lVar18;
            if (line_order == 0) {
              uVar11 = lVar19 + lVar9;
            }
            for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
              *(undefined4 *)(out_images[sVar25] + lVar13 * 4 + uVar11 * lVar14) =
                   *(undefined4 *)(pvVar4 + lVar13 * 4);
            }
          }
        }
        else if (iVar8 == 1) {
          for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                                (lVar19 * pixel_data_size +
                                *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
            uVar11 = ~(lVar9 + lVar19) + lVar18;
            if (line_order == 0) {
              uVar11 = lVar9 + lVar19;
            }
            lVar21 = uVar11 * local_68;
            for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
              if (local_60[sVar25] == 1) {
                *(ushort *)(out_images[sVar25] + lVar13 * 2 + lVar21 * 2) =
                     *(ushort *)(pvVar4 + lVar13 * 2);
              }
              else {
                h_02._2_2_ = 0;
                h_02.u = *(ushort *)(pvVar4 + lVar13 * 2);
                FVar2 = half_to_float(h_02);
                *(FP32 *)(out_images[sVar25] + lVar13 * 4 + lVar21 * 4) = FVar2;
              }
            }
          }
        }
        else if (iVar8 == 2) {
          for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
            pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_58,
                                (lVar19 * pixel_data_size +
                                *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
            uVar11 = ~(lVar19 + lVar9) + lVar18;
            if (line_order == 0) {
              uVar11 = lVar19 + lVar9;
            }
            for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
              *(undefined4 *)(out_images[sVar25] + lVar13 * 4 + uVar11 * lVar14) =
                   *(undefined4 *)(pvVar4 + lVar13 * 4);
            }
          }
        }
      }
      this = &local_58;
      goto LAB_00127872;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
               lVar24 * lVar3 * pixel_data_size,(allocator_type *)&local_58);
    local_58._M_impl.super__Vector_impl_data._M_start =
         local_80._M_impl.super__Vector_impl_data._M_finish +
         -(long)local_80._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,0);
    DecompressZip(pvVar4,(unsigned_long *)&local_58,data_ptr,data_len);
    lVar14 = local_68 * 4;
    for (sVar25 = 0; sVar25 != num_attributes; sVar25 = sVar25 + 1) {
      iVar8 = *(int *)(attributes->type + sVar25 * 0x110);
      if (iVar8 == 0) {
        for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (lVar19 * pixel_data_size +
                              *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
          uVar11 = ~(lVar19 + lVar9) + lVar18;
          if (line_order == 0) {
            uVar11 = lVar19 + lVar9;
          }
          for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
            *(undefined4 *)(out_images[sVar25] + lVar13 * 4 + uVar11 * lVar14) =
                 *(undefined4 *)(pvVar4 + lVar13 * 4);
          }
        }
      }
      else if (iVar8 == 1) {
        for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (lVar19 * pixel_data_size +
                              *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
          uVar11 = ~(lVar9 + lVar19) + lVar18;
          if (line_order == 0) {
            uVar11 = lVar9 + lVar19;
          }
          lVar21 = uVar11 * local_68;
          for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
            if (local_60[sVar25] == 1) {
              *(ushort *)(out_images[sVar25] + lVar13 * 2 + lVar21 * 2) =
                   *(ushort *)(pvVar4 + lVar13 * 2);
            }
            else {
              h_00._2_2_ = 0;
              h_00.u = *(ushort *)(pvVar4 + lVar13 * 2);
              FVar2 = half_to_float(h_00);
              *(FP32 *)(out_images[sVar25] + lVar13 * 4 + lVar21 * 4) = FVar2;
            }
          }
        }
      }
      else if (iVar8 == 2) {
        for (lVar19 = 0; lVar19 != lVar24; lVar19 = lVar19 + 1) {
          pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
                              (lVar19 * pixel_data_size +
                              *(long *)(*(long *)num_channels + sVar25 * 8)) * lVar3);
          uVar11 = ~(lVar19 + lVar9) + lVar18;
          if (line_order == 0) {
            uVar11 = lVar19 + lVar9;
          }
          for (lVar13 = 0; lVar3 != lVar13; lVar13 = lVar13 + 1) {
            *(undefined4 *)(out_images[sVar25] + lVar13 * 4 + uVar11 * lVar14) =
                 *(undefined4 *)(pvVar4 + lVar13 * 4);
          }
        }
      }
    }
  }
  this = &local_80;
LAB_00127872:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
  return;
}

Assistant:

static void DecodePixelData(/* out */ unsigned char **out_images,
                            const int *requested_pixel_types,
                            const unsigned char *data_ptr, size_t data_len,
                            int compression_type, int line_order, int width,
                            int height, int x_stride, int y, int line_no,
                            int num_lines, size_t pixel_data_size,
                            size_t num_attributes,
                            const EXRAttribute *attributes, size_t num_channels,
                            const EXRChannelInfo *channels,
                            const std::vector<size_t> &channel_offset_list) {
  if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {  // PIZ
#if TINYEXR_USE_PIZ
    // Allocate original data size.
    std::vector<unsigned char> outBuf(
        static_cast<size_t>(width * num_lines * pixel_data_size));
    size_t tmpBufLen = static_cast<size_t>(width * num_lines * pixel_data_size);

    bool ret = tinyexr::DecompressPiz(
        reinterpret_cast<unsigned char *>(&outBuf.at(0)), data_ptr, tmpBufLen,
        num_channels, channels, width, num_lines);

    assert(ret);

    // For PIZ_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (int c = 0; c < static_cast<int>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (int v = 0; v < num_lines; v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (line_no + v) * x_stride + u;
              } else {
                image += (height - 1 - (line_no + v)) * x_stride + u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (int v = 0; v < num_lines; v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * width +
                         channel_offset_list[c] * width));
          for (int u = 0; u < width; u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (int v = 0; v < num_lines; v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * x_stride +
                         channel_offset_list[c] * x_stride));
          for (int u = 0; u < width; u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (line_no + v) * x_stride + u;
            } else {
              image += (height - 1 - (line_no + v)) * x_stride + u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    assert(0 && "PIZ is enabled in this build");
#endif

  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZIPS ||
             compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZip(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           &dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_RLE) {
    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressRle(reinterpret_cast<unsigned char *>(&outBuf.at(0)),
                           dstLen, data_ptr,
                           static_cast<unsigned long>(data_len));

    // For ZIP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned short *line_ptr = reinterpret_cast<unsigned short *>(
              &outBuf.at(v * static_cast<size_t>(pixel_data_size) *
                             static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
              unsigned short *image =
                  reinterpret_cast<unsigned short **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = hf.u;
            } else {  // HALF -> FLOAT
              tinyexr::FP32 f32 = half_to_float(hf);
              float *image = reinterpret_cast<float **>(out_images)[c];
              if (line_order == 0) {
                image += (static_cast<size_t>(line_no) + v) *
                             static_cast<size_t>(x_stride) +
                         u;
              } else {
                image += (static_cast<size_t>(height) - 1U -
                          (static_cast<size_t>(line_no) + v)) *
                             static_cast<size_t>(x_stride) +
                         u;
              }
              *image = f32.f;
            }
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT);

        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const unsigned int *line_ptr = reinterpret_cast<unsigned int *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            unsigned int val = line_ptr[u];

            tinyexr::swap4(&val);

            unsigned int *image =
                reinterpret_cast<unsigned int **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param, attributes,
                                 num_attributes)) {
      assert(0);
      return;
    }

    // Allocate original data size.
    std::vector<unsigned char> outBuf(static_cast<size_t>(width) *
                                      static_cast<size_t>(num_lines) *
                                      pixel_data_size);

    unsigned long dstLen = outBuf.size();
    assert(dstLen > 0);
    tinyexr::DecompressZfp(reinterpret_cast<float *>(&outBuf.at(0)), width,
                           num_lines, num_channels, data_ptr,
                           static_cast<unsigned long>(data_len),
                           zfp_compression_param);

    // For ZFP_COMPRESSION:
    //   pixel sample data for channel 0 for scanline 0
    //   pixel sample data for channel 1 for scanline 0
    //   pixel sample data for channel ... for scanline 0
    //   pixel sample data for channel n for scanline 0
    //   pixel sample data for channel 0 for scanline 1
    //   pixel sample data for channel 1 for scanline 1
    //   pixel sample data for channel ... for scanline 1
    //   pixel sample data for channel n for scanline 1
    //   ...
    for (size_t c = 0; c < static_cast<size_t>(num_channels); c++) {
      assert(channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT);
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        assert(requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT);
        for (size_t v = 0; v < static_cast<size_t>(num_lines); v++) {
          const float *line_ptr = reinterpret_cast<float *>(
              &outBuf.at(v * pixel_data_size * static_cast<size_t>(width) +
                         channel_offset_list[c] * static_cast<size_t>(width)));
          for (size_t u = 0; u < static_cast<size_t>(width); u++) {
            float val = line_ptr[u];

            tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

            float *image = reinterpret_cast<float **>(out_images)[c];
            if (line_order == 0) {
              image += (static_cast<size_t>(line_no) + v) *
                           static_cast<size_t>(x_stride) +
                       u;
            } else {
              image += (static_cast<size_t>(height) - 1U -
                        (static_cast<size_t>(line_no) + v)) *
                           static_cast<size_t>(x_stride) +
                       u;
            }
            *image = val;
          }
        }
      } else {
        assert(0);
      }
    }
#else
    (void)attributes;
    (void)num_attributes;
    (void)num_channels;
    assert(0);
#endif
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_NONE) {
    for (size_t c = 0; c < num_channels; c++) {
      if (channels[c].pixel_type == TINYEXR_PIXELTYPE_HALF) {
        const unsigned short *line_ptr =
            reinterpret_cast<const unsigned short *>(
                data_ptr +
                c * static_cast<size_t>(width) * sizeof(unsigned short));

        if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          unsigned short *outLine =
              reinterpret_cast<unsigned short *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            outLine[u] = hf.u;
          }
        } else if (requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          float *outLine = reinterpret_cast<float *>(out_images[c]);
          if (line_order == 0) {
            outLine += y * x_stride;
          } else {
            outLine += (height - 1 - y) * x_stride;
          }

          for (int u = 0; u < width; u++) {
            tinyexr::FP16 hf;

            hf.u = line_ptr[u];

            tinyexr::swap2(reinterpret_cast<unsigned short *>(&hf.u));

            tinyexr::FP32 f32 = half_to_float(hf);

            outLine[u] = f32.f;
          }
        } else {
          assert(0);
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_FLOAT) {
        const float *line_ptr = reinterpret_cast<const float *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(float));

        float *outLine = reinterpret_cast<float *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          float val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      } else if (channels[c].pixel_type == TINYEXR_PIXELTYPE_UINT) {
        const unsigned int *line_ptr = reinterpret_cast<const unsigned int *>(
            data_ptr + c * static_cast<size_t>(width) * sizeof(unsigned int));

        unsigned int *outLine = reinterpret_cast<unsigned int *>(out_images[c]);
        if (line_order == 0) {
          outLine += y * x_stride;
        } else {
          outLine += (height - 1 - y) * x_stride;
        }

        for (int u = 0; u < width; u++) {
          unsigned int val = line_ptr[u];

          tinyexr::swap4(reinterpret_cast<unsigned int *>(&val));

          outLine[u] = val;
        }
      }
    }
  }
}